

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O3

int header_odc(archive_read *a,cpio_conflict *cpio,archive_entry *entry,size_t *namelength,
              size_t *name_pad)

{
  byte bVar1;
  int iVar2;
  int *h;
  ulong uVar3;
  void *pvVar4;
  dev_t dVar5;
  int64_t iVar6;
  size_t sVar7;
  long lVar8;
  uint nlink;
  int *piVar9;
  ulong uVar10;
  mode_t mVar11;
  int *h_00;
  long lVar12;
  ssize_t bytes;
  size_t local_38;
  
  (a->archive).archive_format = 0x10001;
  (a->archive).archive_format_name = "POSIX octet-oriented cpio";
  h = (int *)__archive_read_ahead(a,0x4c,(ssize_t *)&local_38);
  if (h != (int *)0x0) {
    lVar12 = 0;
    do {
      sVar7 = local_38;
      if ((short)h[1] == 0x3730 && *h == 0x37303730) {
        lVar8 = -0x4c;
        while (0xf7 < (byte)(*(char *)((long)h + lVar8 + 0x4c) - 0x38U)) {
          lVar8 = lVar8 + 1;
          if (lVar8 == 0) {
            iVar2 = 0;
            goto LAB_0012268e;
          }
        }
      }
      if (((short)h[1] == 0x3732 && *h == 0x37303730) &&
         (iVar2 = is_afio_large((char *)h,local_38), iVar2 != 0)) {
        iVar2 = 0;
LAB_0012269c:
        (a->archive).archive_format = 0x10006;
        (a->archive).archive_format_name = "afio large ASCII";
        mVar11 = 0;
        pvVar4 = __archive_read_ahead(a,0x74,(ssize_t *)0x0);
        if (pvVar4 == (void *)0x0) {
          return -0x1e;
        }
        dVar5 = atol16((char *)((long)pvVar4 + 6),8);
        archive_entry_set_dev(entry,dVar5);
        iVar6 = atol16((char *)((long)pvVar4 + 0xe),0x10);
        archive_entry_set_ino(entry,iVar6);
        lVar12 = 0;
        goto LAB_00122702;
      }
      piVar9 = h;
      if (0x4b < (long)sVar7) {
        uVar10 = sVar7 + (long)h;
        h_00 = h;
        while (*(char *)((long)h_00 + 5) == '0') {
          lVar8 = 1;
LAB_001225e1:
          piVar9 = (int *)((long)h_00 + lVar8);
          uVar3 = (long)h_00 + lVar8 + 0x4c;
          h_00 = piVar9;
          if (uVar10 < uVar3) goto LAB_0012253c;
        }
        if (*(char *)((long)h_00 + 5) != '7') {
          lVar8 = 6;
          goto LAB_001225e1;
        }
        if ((short)h_00[1] == 0x3730 && *h_00 == 0x37303730) {
          lVar8 = -0x4c;
          while (0xf7 < (byte)(*(char *)((long)h_00 + lVar8 + 0x4c) - 0x38U)) {
            lVar8 = lVar8 + 1;
            if (lVar8 == 0) goto LAB_0012263a;
          }
        }
        lVar8 = 2;
        if (((short)h_00[1] != 0x3732 || *h_00 != 0x37303730) ||
           (iVar2 = is_afio_large((char *)h_00,uVar10 - (long)h_00), iVar2 == 0)) goto LAB_001225e1;
LAB_0012263a:
        __archive_read_consume(a,(long)h_00 - (long)h);
        uVar10 = ((long)h_00 - (long)h) + lVar12;
        if ((char)h_00[1] == '2') {
          (a->archive).archive_format = 0x10006;
        }
        if (uVar10 == 0) {
          iVar2 = 0;
        }
        else {
          archive_set_error(&a->archive,0,"Skipped %d bytes before finding valid header",
                            uVar10 & 0xffffffff);
          iVar2 = -0x14;
        }
LAB_0012268e:
        if ((a->archive).archive_format == 0x10006) goto LAB_0012269c;
        pvVar4 = __archive_read_ahead(a,0x4c,(ssize_t *)0x0);
        if (pvVar4 == (void *)0x0) {
          return -0x1e;
        }
        lVar12 = 0;
        dVar5 = 0;
        goto LAB_00122829;
      }
LAB_0012253c:
      __archive_read_consume(a,(long)piVar9 - (long)h);
      lVar12 = lVar12 + ((long)piVar9 - (long)h);
      h = (int *)__archive_read_ahead(a,0x4c,(ssize_t *)&local_38);
    } while (h != (int *)0x0);
  }
  return -0x1e;
  while( true ) {
    dVar5 = (ulong)(byte)(bVar1 - 0x30) + dVar5 * 8;
    lVar12 = lVar12 + 1;
    if ((int)lVar12 == 6) break;
LAB_00122829:
    bVar1 = *(byte *)((long)pvVar4 + lVar12 + 6);
    if ((bVar1 & 0xf8) != 0x30) break;
  }
  archive_entry_set_dev(entry,dVar5);
  lVar8 = 0;
  lVar12 = 0;
  do {
    bVar1 = *(byte *)((long)pvVar4 + lVar8 + 0xc);
    if ((bVar1 & 0xf8) != 0x30) break;
    lVar12 = (ulong)(byte)(bVar1 - 0x30) + lVar12 * 8;
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 6);
  archive_entry_set_ino(entry,lVar12);
  lVar12 = 0;
  mVar11 = 0;
  do {
    bVar1 = *(byte *)((long)pvVar4 + lVar12 + 0x12);
    if ((bVar1 & 0xf8) != 0x30) break;
    mVar11 = (uint)(byte)(bVar1 - 0x30) + mVar11 * 8;
    lVar12 = lVar12 + 1;
  } while ((int)lVar12 != 6);
  archive_entry_set_mode(entry,mVar11);
  lVar8 = 0;
  lVar12 = 0;
  do {
    bVar1 = *(byte *)((long)pvVar4 + lVar8 + 0x18);
    if ((bVar1 & 0xf8) != 0x30) break;
    lVar12 = (ulong)(byte)(bVar1 - 0x30) + lVar12 * 8;
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 6);
  archive_entry_set_uid(entry,lVar12);
  lVar8 = 0;
  lVar12 = 0;
  do {
    bVar1 = *(byte *)((long)pvVar4 + lVar8 + 0x1e);
    if ((bVar1 & 0xf8) != 0x30) break;
    lVar12 = (ulong)(byte)(bVar1 - 0x30) + lVar12 * 8;
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 6);
  archive_entry_set_gid(entry,lVar12);
  lVar12 = 0;
  nlink = 0;
  do {
    bVar1 = *(byte *)((long)pvVar4 + lVar12 + 0x24);
    if ((bVar1 & 0xf8) != 0x30) break;
    nlink = (uint)(byte)(bVar1 - 0x30) + nlink * 8;
    lVar12 = lVar12 + 1;
  } while ((int)lVar12 != 6);
  archive_entry_set_nlink(entry,nlink);
  lVar12 = 0;
  dVar5 = 0;
  do {
    bVar1 = *(byte *)((long)pvVar4 + lVar12 + 0x2a);
    if ((bVar1 & 0xf8) != 0x30) break;
    dVar5 = (ulong)(byte)(bVar1 - 0x30) + dVar5 * 8;
    lVar12 = lVar12 + 1;
  } while ((int)lVar12 != 6);
  archive_entry_set_rdev(entry,dVar5);
  lVar8 = 0;
  lVar12 = 0;
  do {
    bVar1 = *(byte *)((long)pvVar4 + lVar8 + 0x30);
    if ((bVar1 & 0xf8) != 0x30) break;
    lVar12 = (ulong)(byte)(bVar1 - 0x30) + lVar12 * 8;
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 0xb);
  lVar8 = 0;
  archive_entry_set_mtime(entry,lVar12,0);
  sVar7 = 0;
  do {
    bVar1 = *(byte *)((long)pvVar4 + lVar8 + 0x3b);
    if ((bVar1 & 0xf8) != 0x30) break;
    sVar7 = (ulong)(byte)(bVar1 - 0x30) + sVar7 * 8;
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 6);
  *namelength = sVar7;
  *name_pad = 0;
  lVar8 = 0;
  lVar12 = 0;
  do {
    bVar1 = *(byte *)((long)pvVar4 + lVar8 + 0x41);
    if ((bVar1 & 0xf8) != 0x30) break;
    lVar12 = (ulong)(byte)(bVar1 - 0x30) + lVar12 * 8;
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 0xb);
  cpio->entry_bytes_remaining = lVar12;
  archive_entry_set_size(entry,lVar12);
  cpio->entry_padding = 0;
  iVar6 = 0x4c;
  goto LAB_00122a0c;
  while( true ) {
    mVar11 = (uint)(byte)(bVar1 - 0x30) + mVar11 * 8;
    lVar12 = lVar12 + 1;
    if ((int)lVar12 == 6) break;
LAB_00122702:
    bVar1 = *(byte *)((long)pvVar4 + lVar12 + 0x1f);
    if ((bVar1 & 0xf8) != 0x30) break;
  }
  archive_entry_set_mode(entry,mVar11);
  iVar6 = atol16((char *)((long)pvVar4 + 0x25),8);
  archive_entry_set_uid(entry,iVar6);
  iVar6 = atol16((char *)((long)pvVar4 + 0x2d),8);
  archive_entry_set_gid(entry,iVar6);
  iVar6 = atol16((char *)((long)pvVar4 + 0x35),8);
  archive_entry_set_nlink(entry,(uint)iVar6);
  dVar5 = atol16((char *)((long)pvVar4 + 0x3d),8);
  archive_entry_set_rdev(entry,dVar5);
  iVar6 = atol16((char *)((long)pvVar4 + 0x45),0x10);
  archive_entry_set_mtime(entry,iVar6,0);
  sVar7 = atol16((char *)((long)pvVar4 + 0x56),4);
  *namelength = sVar7;
  *name_pad = 0;
  iVar6 = atol16((char *)((long)pvVar4 + 99),0x10);
  cpio->entry_bytes_remaining = iVar6;
  archive_entry_set_size(entry,iVar6);
  cpio->entry_padding = 0;
  iVar6 = 0x74;
LAB_00122a0c:
  __archive_read_consume(a,iVar6);
  return iVar2;
}

Assistant:

static int
header_odc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	int r;
	const char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_POSIX;
	a->archive.archive_format_name = "POSIX octet-oriented cpio";

	/* Find the start of the next header. */
	r = find_odc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_AFIO_LARGE) {
		int r2 = (header_afiol(a, cpio, entry, namelength, name_pad));
		if (r2 == ARCHIVE_OK)
			return (r);
		else
			return (r2);
	}

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, odc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out octal fields. */
	header = (const char *)h;

	archive_entry_set_dev(entry, 
		(dev_t)atol8(header + odc_dev_offset, odc_dev_size));
	archive_entry_set_ino(entry, atol8(header + odc_ino_offset, odc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol8(header + odc_mode_offset, odc_mode_size));
	archive_entry_set_uid(entry, atol8(header + odc_uid_offset, odc_uid_size));
	archive_entry_set_gid(entry, atol8(header + odc_gid_offset, odc_gid_size));
	archive_entry_set_nlink(entry, 
		(unsigned int)atol8(header + odc_nlink_offset, odc_nlink_size));
	archive_entry_set_rdev(entry,
		(dev_t)atol8(header + odc_rdev_offset, odc_rdev_size));
	archive_entry_set_mtime(entry, atol8(header + odc_mtime_offset, odc_mtime_size), 0);
	*namelength = (size_t)atol8(header + odc_namesize_offset, odc_namesize_size);
	*name_pad = 0; /* No padding of filename. */

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol8(header + odc_filesize_offset, odc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = 0;
	__archive_read_consume(a, odc_header_size);
	return (r);
}